

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O2

void __thiscall QTableView::updateGeometries(QTableView *this)

{
  long lVar1;
  long lVar2;
  QHeaderViewPrivate *this_00;
  bool bVar3;
  Representation RVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ScrollMode SVar10;
  QSize QVar11;
  int extraout_var;
  QSize QVar12;
  QSize QVar13;
  QScrollBar *pQVar14;
  int iVar15;
  int width;
  int iVar16;
  int iVar17;
  Representation local_50;
  
  lVar1 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  if (*(char *)(lVar1 + 0x641) != '\0') {
    return;
  }
  *(undefined1 *)(lVar1 + 0x641) = 1;
  RVar4.m_i = 0;
  if (((*(QWidget **)(lVar1 + 0x588))->data->widget_attributes & 0x10000) == 0) {
    QVar11 = QWidget::minimumSize(*(QWidget **)(lVar1 + 0x588));
    RVar4.m_i = (**(code **)(**(long **)(lVar1 + 0x588) + 0x70))();
    if (RVar4.m_i < QVar11.wd.m_i.m_i) {
      RVar4.m_i = QVar11.wd.m_i.m_i;
    }
    QVar11 = QWidget::maximumSize(*(QWidget **)(lVar1 + 0x588));
    if (QVar11.wd.m_i.m_i <= RVar4.m_i) {
      RVar4.m_i = QVar11.wd.m_i.m_i;
    }
  }
  iVar7 = 0;
  if (((*(QWidget **)(lVar1 + 0x580))->data->widget_attributes & 0x10000) == 0) {
    iVar5 = QWidget::minimumHeight(*(QWidget **)(lVar1 + 0x580));
    (**(code **)(**(long **)(lVar1 + 0x580) + 0x70))();
    iVar7 = extraout_var;
    if (extraout_var < iVar5) {
      iVar7 = iVar5;
    }
    iVar5 = QWidget::maximumHeight(*(QWidget **)(lVar1 + 0x580));
    if (iVar5 <= iVar7) {
      iVar7 = iVar5;
    }
  }
  bVar3 = QWidget::isRightToLeft((QWidget *)this);
  if (bVar3) {
    iVar5 = RVar4.m_i;
    iVar15 = 0;
  }
  else {
    iVar5 = 0;
    iVar15 = RVar4.m_i;
  }
  QAbstractScrollArea::setViewportMargins((QAbstractScrollArea *)this,iVar15,iVar7,iVar5,0);
  lVar2 = *(long *)(*(long *)(lVar1 + 0x2b0) + 0x20);
  iVar5 = *(int *)(lVar2 + 0x14);
  iVar15 = *(int *)(lVar2 + 0x18);
  iVar8 = *(int *)(lVar2 + 0x1c);
  iVar16 = iVar5 - RVar4.m_i;
  if (bVar3) {
    iVar16 = iVar8 + 1;
  }
  QWidget::setGeometry
            (*(QWidget **)(lVar1 + 0x588),iVar16,iVar15,RVar4.m_i,
             (*(int *)(lVar2 + 0x20) - iVar15) + 1);
  if ((*(byte *)(*(long *)(*(QObject **)(lVar1 + 0x588) + 0x20) + 10) & 1) != 0) {
    QMetaObject::invokeMethod<>(*(QObject **)(lVar1 + 0x588),"updateGeometries");
  }
  QWidget::setGeometry(*(QWidget **)(lVar1 + 0x580),iVar5,iVar15 - iVar7,(iVar8 - iVar5) + 1,iVar7);
  uVar6 = *(uint *)(*(long *)(*(QObject **)(lVar1 + 0x580) + 0x20) + 8);
  if ((uVar6 >> 0x10 & 1) != 0) {
    QMetaObject::invokeMethod<>(*(QObject **)(lVar1 + 0x580),"updateGeometries");
    uVar6 = *(uint *)(*(long *)(*(long *)(lVar1 + 0x580) + 0x20) + 8);
  }
  if (((uVar6 >> 0x10 & 1) == 0) &&
     ((*(byte *)(*(long *)(*(long *)(lVar1 + 0x588) + 0x20) + 10) & 1) == 0)) {
    QWidget::setHidden(*(QWidget **)(lVar1 + 0x590),false);
    QWidget::setGeometry(*(QWidget **)(lVar1 + 0x590),iVar16,iVar15 - iVar7,RVar4.m_i,iVar7);
  }
  else {
    QWidget::setHidden(*(QWidget **)(lVar1 + 0x590),true);
  }
  QVar12 = QWidget::size(*(QWidget **)(lVar1 + 0x2b0));
  QVar13 = QAbstractScrollArea::maximumViewportSize((QAbstractScrollArea *)this);
  iVar7 = QHeaderView::length(*(QHeaderView **)(lVar1 + 0x580));
  iVar5 = QHeaderView::length(*(QHeaderView **)(lVar1 + 0x588));
  QVar11 = QVar13;
  if (QVar13.ht.m_i.m_i < iVar5) {
    QVar11 = QVar12;
  }
  if (QVar13.wd.m_i.m_i < iVar7) {
    QVar11 = QVar12;
  }
  iVar8 = QHeaderView::count(*(QHeaderView **)(lVar1 + 0x580));
  iVar17 = 0;
  iVar16 = 0;
  iVar15 = iVar8;
  while (RVar4 = QVar11.wd.m_i, 0 < iVar15) {
    iVar15 = iVar15 + -1;
    iVar9 = QHeaderView::logicalIndex(*(QHeaderView **)(lVar1 + 0x580),iVar15);
    bVar3 = QHeaderView::isSectionHidden(*(QHeaderView **)(lVar1 + 0x580),iVar9);
    if (!bVar3) {
      iVar9 = QHeaderView::sectionSize(*(QHeaderView **)(lVar1 + 0x580),iVar9);
      iVar16 = iVar16 + iVar9;
      if (RVar4.m_i < iVar16) break;
      iVar17 = iVar17 + 1;
    }
  }
  if (iVar17 < 2) {
    iVar17 = 1;
  }
  SVar10 = QAbstractItemView::horizontalScrollMode((QAbstractItemView *)this);
  if (SVar10 == ScrollPerItem) {
    iVar7 = QHeaderView::hiddenSectionCount(*(QHeaderView **)(lVar1 + 0x580));
    pQVar14 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
    QAbstractSlider::setRange(&pQVar14->super_QAbstractSlider,0,(iVar8 - iVar7) - iVar17);
    pQVar14 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
    QAbstractSlider::setPageStep(&pQVar14->super_QAbstractSlider,iVar17);
    if (iVar8 - iVar7 <= iVar17) {
      QHeaderView::setOffset(*(QHeaderView **)(lVar1 + 0x580),0);
    }
    pQVar14 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
    QAbstractSlider::setSingleStep(&pQVar14->super_QAbstractSlider,1);
  }
  else {
    pQVar14 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
    QAbstractSlider::setPageStep(&pQVar14->super_QAbstractSlider,RVar4.m_i);
    pQVar14 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
    QAbstractSlider::setRange(&pQVar14->super_QAbstractSlider,0,iVar7 - RVar4.m_i);
    pQVar14 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
    iVar7 = (int)((long)((ulong)(uint)(RVar4.m_i >> 0x1f) << 0x20 | (ulong)QVar11 & 0xffffffff) /
                 (long)(iVar17 + 1));
    if (iVar7 < 3) {
      iVar7 = 2;
    }
    QAbstractSliderPrivate::itemviewChangeSingleStep
              (*(QAbstractSliderPrivate **)&(pQVar14->super_QAbstractSlider).super_QWidget.field_0x8
               ,iVar7);
  }
  iVar15 = QHeaderView::count(*(QHeaderView **)(lVar1 + 0x588));
  iVar16 = 0;
  iVar8 = 0;
  iVar7 = iVar15;
  while (local_50 = QVar11.ht.m_i, 0 < iVar7) {
    iVar7 = iVar7 + -1;
    iVar17 = QHeaderView::logicalIndex(*(QHeaderView **)(lVar1 + 0x588),iVar7);
    bVar3 = QHeaderView::isSectionHidden(*(QHeaderView **)(lVar1 + 0x588),iVar17);
    if (!bVar3) {
      iVar17 = QHeaderView::sectionSize(*(QHeaderView **)(lVar1 + 0x588),iVar17);
      iVar8 = iVar8 + iVar17;
      if (local_50.m_i < iVar8) break;
      iVar16 = iVar16 + 1;
    }
  }
  iVar7 = 1;
  if (1 < iVar16) {
    iVar7 = iVar16;
  }
  SVar10 = QAbstractItemView::verticalScrollMode((QAbstractItemView *)this);
  if (SVar10 == ScrollPerItem) {
    iVar5 = QHeaderView::hiddenSectionCount(*(QHeaderView **)(lVar1 + 0x588));
    pQVar14 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
    QAbstractSlider::setRange(&pQVar14->super_QAbstractSlider,0,(iVar15 - iVar5) - iVar7);
    pQVar14 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
    QAbstractSlider::setPageStep(&pQVar14->super_QAbstractSlider,iVar7);
    if (iVar15 - iVar5 <= iVar7) {
      QHeaderView::setOffset(*(QHeaderView **)(lVar1 + 0x588),0);
    }
    pQVar14 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
    QAbstractSlider::setSingleStep(&pQVar14->super_QAbstractSlider,1);
  }
  else {
    pQVar14 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
    QAbstractSlider::setPageStep(&pQVar14->super_QAbstractSlider,local_50.m_i);
    pQVar14 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
    QAbstractSlider::setRange(&pQVar14->super_QAbstractSlider,0,iVar5 - local_50.m_i);
    pQVar14 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
    iVar5 = (int)((long)((ulong)(uint)(local_50.m_i >> 0x1f) << 0x20 | (ulong)QVar11 >> 0x20) /
                 (long)(iVar7 + 1));
    iVar7 = 2;
    if (2 < iVar5) {
      iVar7 = iVar5;
    }
    QAbstractSliderPrivate::itemviewChangeSingleStep
              (*(QAbstractSliderPrivate **)&(pQVar14->super_QAbstractSlider).super_QWidget.field_0x8
               ,iVar7);
  }
  this_00 = *(QHeaderViewPrivate **)(*(long *)(lVar1 + 0x588) + 8);
  pQVar14 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
  SVar10 = QAbstractItemView::verticalScrollMode((QAbstractItemView *)this);
  QHeaderViewPrivate::setScrollOffset(this_00,pQVar14,SVar10);
  *(undefined1 *)(lVar1 + 0x641) = 0;
  QAbstractItemView::updateGeometries((QAbstractItemView *)this);
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }